

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O2

Acec_Box_t *
Acec_DeriveBox(Gia_Man_t *p,Vec_Bit_t *vIgnore,int fFilterIn,int fFilterOut,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *vAdds;
  Vec_Int_t *vTree;
  Acec_Box_t *pBox;
  Vec_Wec_t *vTrees;
  Vec_Wec_t *local_38;
  
  pBox = (Acec_Box_t *)0x0;
  vAdds = Ree_ManComputeCuts(p,(Vec_Int_t **)0x0,fVerbose);
  local_38 = Acec_TreeFindTrees(p,vAdds,vIgnore,fFilterIn,fFilterOut);
  if (local_38 != (Vec_Wec_t *)0x0) {
    if (0 < local_38->nSize) {
      vTree = Vec_WecEntry(local_38,0);
      pBox = Acec_CreateBox(p,vAdds,vTree);
      Acec_VerifyBoxLeaves(pBox,vIgnore);
      if (pBox != (Acec_Box_t *)0x0) {
        uVar1 = pBox->vAdds->nSize;
        uVar2 = Vec_WecSizeSize(pBox->vAdds);
        uVar3 = Vec_WecSizeSize(pBox->vLeafLits);
        uVar4 = Vec_WecSizeSize(pBox->vRootLits);
        printf("Processing tree %d:  Ranks = %d.  Adders = %d.  Leaves = %d.  Roots = %d.\n",0,
               (ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
        if (fVerbose != 0) {
          Acec_TreePrintBox(pBox,vAdds);
        }
        goto LAB_00547fcd;
      }
    }
    pBox = (Acec_Box_t *)0x0;
  }
LAB_00547fcd:
  Vec_WecFreeP(&local_38);
  Vec_IntFree(vAdds);
  return pBox;
}

Assistant:

Acec_Box_t * Acec_DeriveBox( Gia_Man_t * p, Vec_Bit_t * vIgnore, int fFilterIn, int fFilterOut, int fVerbose )
{
    Acec_Box_t * pBox = NULL;
    Vec_Int_t * vAdds = Ree_ManComputeCuts( p, NULL, fVerbose );
    Vec_Wec_t * vTrees = Acec_TreeFindTrees( p, vAdds, vIgnore, fFilterIn, fFilterOut );
    if ( vTrees && Vec_WecSize(vTrees) > 0 )
    {
        pBox = Acec_CreateBox( p, vAdds, Vec_WecEntry(vTrees, 0) );
        Acec_VerifyBoxLeaves( pBox, vIgnore );
    }
    if ( pBox )//&& fVerbose )
        printf( "Processing tree %d:  Ranks = %d.  Adders = %d.  Leaves = %d.  Roots = %d.\n", 
            0, Vec_WecSize(pBox->vAdds), Vec_WecSizeSize(pBox->vAdds), 
            Vec_WecSizeSize(pBox->vLeafLits), Vec_WecSizeSize(pBox->vRootLits)  );
    if ( pBox && fVerbose )
        Acec_TreePrintBox( pBox, vAdds );
    //Acec_PrintAdders( pBox0->vAdds, vAdds );
    //Acec_MultDetectInputs( p, pBox->vLeafLits, pBox->vRootLits );
    Vec_WecFreeP( &vTrees );
    Vec_IntFree( vAdds );
    return pBox;
}